

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O2

void duckdb::alp::AlpCompression<double,_false>::Compress
               (double *input_vector,idx_t n_values,uint16_t *vector_null_positions,
               idx_t nulls_count,State *state)

{
  int64_t *src;
  double dVar1;
  undefined2 uVar12;
  undefined2 uVar13;
  uint64_t uVar2;
  byte width;
  idx_t i_4;
  reference pvVar3;
  int64_t iVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t i;
  idx_t iVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint64_t uVar10;
  double dVar11;
  
  if ((ulong)(((long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(state->best_k_combinations).
                    super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                    .
                    super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 2) {
    pvVar3 = vector<duckdb::alp::AlpCombination,_true>::get<true>(&state->best_k_combinations,0);
    state->vector_encoding_indices = pvVar3->encoding_indices;
  }
  else {
    FindBestFactorAndExponent(input_vector,n_values,state);
  }
  src = state->encoded_integers;
  iVar7 = 0;
  uVar5 = 0;
  while( true ) {
    uVar9 = uVar5 & 0xffff;
    if (n_values == iVar7) break;
    dVar1 = input_vector[iVar7];
    uVar12._0_1_ = (state->vector_encoding_indices).exponent;
    uVar12._1_1_ = (state->vector_encoding_indices).factor;
    iVar4 = EncodeValue(dVar1,(AlpEncodingIndices)uVar12);
    uVar13._0_1_ = (state->vector_encoding_indices).exponent;
    uVar13._1_1_ = (state->vector_encoding_indices).factor;
    dVar11 = DecodeValue(iVar4,(AlpEncodingIndices)uVar13);
    state->encoded_integers[iVar7] = iVar4;
    state->exceptions_positions[uVar9] = (uint16_t)iVar7;
    iVar7 = iVar7 + 1;
    uVar5 = (ulong)((int)uVar9 + (uint)(dVar11 != dVar1));
  }
  iVar4 = 0;
  iVar7 = 0;
  do {
    if (n_values == iVar7) {
LAB_0049c2d4:
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        dVar1 = input_vector[state->exceptions_positions[uVar6]];
        state->encoded_integers[state->exceptions_positions[uVar6]] = iVar4;
        state->exceptions[uVar6] = dVar1;
      }
      state->exceptions_count = (uint16_t)uVar5;
      for (iVar7 = 0; nulls_count != iVar7; iVar7 = iVar7 + 1) {
        src[vector_null_positions[iVar7]] = iVar4;
      }
      uVar10 = 0x7fffffffffffffff;
      uVar8 = 0x8000000000000000;
      for (iVar7 = 0; n_values != iVar7; iVar7 = iVar7 + 1) {
        uVar2 = src[iVar7];
        if ((long)uVar8 <= (long)uVar2) {
          uVar8 = uVar2;
        }
        if ((long)uVar2 <= (long)uVar10) {
          uVar10 = uVar2;
        }
      }
      for (iVar7 = 0; n_values != iVar7; iVar7 = iVar7 + 1) {
        src[iVar7] = src[iVar7] - uVar10;
      }
      width = BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(uVar8 - uVar10);
      iVar7 = BitpackingPrimitives::GetRequiredSize(n_values,width);
      if (width != 0) {
        BitpackingPrimitives::PackBuffer<unsigned_long,false>
                  (state->values_encoded,(unsigned_long *)src,n_values,width);
      }
      state->bit_width = (ushort)width;
      state->bp_size = iVar7;
      state->frame_of_reference = uVar10;
      return;
    }
    if (iVar7 != state->exceptions_positions[iVar7]) {
      iVar4 = state->encoded_integers[iVar7];
      goto LAB_0049c2d4;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

static void Compress(const T *input_vector, idx_t n_values, const uint16_t *vector_null_positions,
	                     idx_t nulls_count, State &state) {
		if (state.best_k_combinations.size() > 1) {
			FindBestFactorAndExponent(input_vector, n_values, state);
		} else {
			state.vector_encoding_indices = state.best_k_combinations[0].encoding_indices;
		}

		// Encoding Floating-Point to Int64
		//! We encode all the values regardless of their correctness to recover the original floating-point
		uint16_t exceptions_idx = 0;
		for (idx_t i = 0; i < n_values; i++) {
			T actual_value = input_vector[i];
			int64_t encoded_value = EncodeValue(actual_value, state.vector_encoding_indices);
			T decoded_value = DecodeValue(encoded_value, state.vector_encoding_indices);
			state.encoded_integers[i] = encoded_value;
			//! We detect exceptions using a predicated comparison
			auto is_exception = (decoded_value != actual_value);
			state.exceptions_positions[exceptions_idx] = UnsafeNumericCast<uint16_t>(i);
			exceptions_idx += is_exception;
		}

		// Finding first non exception value
		int64_t a_non_exception_value = 0;
		for (idx_t i = 0; i < n_values; i++) {
			if (i != state.exceptions_positions[i]) {
				a_non_exception_value = state.encoded_integers[i];
				break;
			}
		}
		// Replacing that first non exception value on the vector exceptions
		for (idx_t i = 0; i < exceptions_idx; i++) {
			idx_t exception_pos = state.exceptions_positions[i];
			T actual_value = input_vector[exception_pos];
			state.encoded_integers[exception_pos] = a_non_exception_value;
			state.exceptions[i] = actual_value;
		}
		state.exceptions_count = exceptions_idx;

		// Replacing nulls with that first non exception value
		for (idx_t i = 0; i < nulls_count; i++) {
			uint16_t null_value_pos = vector_null_positions[i];
			state.encoded_integers[null_value_pos] = a_non_exception_value;
		}

		// Analyze FFOR
		auto min_value = NumericLimits<int64_t>::Maximum();
		auto max_value = NumericLimits<int64_t>::Minimum();
		for (idx_t i = 0; i < n_values; i++) {
			max_value = MaxValue(max_value, state.encoded_integers[i]);
			min_value = MinValue(min_value, state.encoded_integers[i]);
		}
		uint64_t min_max_diff = (static_cast<uint64_t>(max_value) - static_cast<uint64_t>(min_value));

		auto *u_encoded_integers = reinterpret_cast<uint64_t *>(state.encoded_integers);
		auto const u_min_value = static_cast<uint64_t>(min_value);

		// Subtract FOR
		if (!EMPTY) { //! We only execute the FOR if we are writing the data
			for (idx_t i = 0; i < n_values; i++) {
				u_encoded_integers[i] -= u_min_value;
			}
		}

		auto bit_width = BitpackingPrimitives::MinimumBitWidth<uint64_t, false>(min_max_diff);
		auto bp_size = BitpackingPrimitives::GetRequiredSize(n_values, bit_width);
		if (!EMPTY && bit_width > 0) { //! We only execute the BP if we are writing the data
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.values_encoded, u_encoded_integers, n_values,
			                                                  bit_width);
		}
		state.bit_width = bit_width;                                 // in bits
		state.bp_size = bp_size;                                     // in bytes
		state.frame_of_reference = static_cast<uint64_t>(min_value); // understood this can be negative
	}